

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O0

pair<int,_Point>
findClosestIntersection<Sphere>(vector<Sphere,_std::allocator<Sphere>_> *objects,Segment *seg)

{
  pair<bool,_Point> *ppVar1;
  undefined8 segment;
  pair<bool,_Point> *ppVar2;
  const_reference sphere;
  float fVar3;
  float dist;
  pair<bool,_Point> pStack_60;
  undefined1 *local_50;
  pair<bool,_Point> *res;
  size_t i;
  int local_38;
  float closestDistance;
  int sphereIndex;
  Point closestPoint;
  Segment *seg_local;
  vector<Sphere,_std::allocator<Sphere>_> *objects_local;
  
  closestPoint._4_8_ = seg;
  memset(&closestDistance,0,0xc);
  local_38 = -1;
  i._4_4_ = std::numeric_limits<float>::max();
  for (res = (pair<bool,_Point> *)0x0; ppVar1 = res,
      ppVar2 = (pair<bool,_Point> *)std::vector<Sphere,_std::allocator<Sphere>_>::size(objects),
      segment = closestPoint._4_8_, ppVar1 < ppVar2; res = (pair<bool,_Point> *)&res->field_0x1) {
    sphere = std::vector<Sphere,_std::allocator<Sphere>_>::operator[](objects,(size_type)res);
    pStack_60 = intersection((Segment *)segment,sphere);
    local_50 = &stack0xffffffffffffffa0.first;
    if ((((undefined1  [16])pStack_60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (fVar3 = distance((Point *)closestPoint._4_8_,(Point *)&dist), fVar3 < i._4_4_)) {
      _closestDistance = *(undefined8 *)(local_50 + 4);
      closestPoint.x = *(float *)(local_50 + 0xc);
      local_38 = (int)res;
      i._4_4_ = fVar3;
    }
  }
  std::pair<int,_Point>::pair<int_&,_Point_&,_true>
            ((pair<int,_Point> *)&objects_local,&local_38,(Point *)&closestDistance);
  return _objects_local;
}

Assistant:

std::pair<int, Point> findClosestIntersection(std::vector<T> const& objects, Segment const& seg)
{
  Point closestPoint{};
  int sphereIndex = -1;
  float closestDistance = std::numeric_limits<float>::max();

  for (size_t i = 0; i < objects.size(); i++)
  {
    auto const& res = intersection(seg, objects[i]);
    if (!res.first)
      continue;

    float dist = distance(seg.a, res.second);
    if (dist < closestDistance)
    {
      closestDistance = dist;
      closestPoint = res.second;
      sphereIndex = i;
    }
  }
  return {sphereIndex, closestPoint};
}